

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O0

bool __thiscall
Minisat::OnlineProofChecker::addClause<Minisat::Clause>
          (OnlineProofChecker *this,Clause *clause,Lit *remLit,bool checkOnly)

{
  bool bVar1;
  int iVar2;
  Lit *elem;
  byte in_CL;
  Lit *in_RDX;
  Clause *in_RSI;
  long in_RDI;
  int i;
  bool in_stack_0000012f;
  vec<Minisat::Lit> *in_stack_00000130;
  OnlineProofChecker *in_stack_00000138;
  Lit *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  Lit local_28;
  int local_24;
  undefined4 local_20;
  byte local_19;
  Lit *local_18;
  Clause *local_10;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  vec<Minisat::Lit>::clear
            ((vec<Minisat::Lit> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0));
  local_20 = 0xfffffffe;
  bVar1 = Lit::operator!=(local_18,(Lit)0xfffffffe);
  if (bVar1) {
    vec<Minisat::Lit>::push
              ((vec<Minisat::Lit> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
  }
  local_24 = 0;
  while (iVar3 = local_24, iVar2 = Clause::size(local_10), iVar3 < iVar2) {
    local_28 = Clause::operator[](local_10,local_24);
    bVar1 = Lit::operator!=(&local_28,(Lit)local_18->x);
    if (bVar1) {
      elem = (Lit *)(in_RDI + 0xe8);
      Clause::operator[](local_10,local_24);
      vec<Minisat::Lit>::push((vec<Minisat::Lit> *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),elem);
    }
    local_24 = local_24 + 1;
  }
  bVar1 = addClause(in_stack_00000138,in_stack_00000130,in_stack_0000012f);
  return bVar1;
}

Assistant:

inline bool OnlineProofChecker::addClause(const T &clause, const Lit &remLit, bool checkOnly)
{
    // create a clause where remLit is the first literal
    tmpLits.clear();
    if (remLit != lit_Undef) {
        tmpLits.push(remLit);
    }
    for (int i = 0; i < clause.size(); ++i) {
        if (clause[i] != remLit) {
            tmpLits.push(clause[i]);
        }
    }
    // add this clause in the usual way
    return addClause(tmpLits, checkOnly);
}